

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O0

shared_ptr<SchemeVector> __thiscall
SchemeVector::from_list(SchemeVector *this,shared_ptr<SchemePair> *list)

{
  initializer_list<const_SchemePair_*> __l;
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  size_type sVar4;
  eval_error *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  shared_ptr<SchemeVector> sVar7;
  bool local_d1;
  element_type *local_a0;
  element_type *local_98;
  shared_ptr<SchemeObject> local_90 [2];
  allocator<const_SchemePair_*> local_6a;
  less<const_SchemePair_*> local_69;
  element_type *local_68;
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
  visited;
  shared_ptr<SchemePair> *list_local;
  shared_ptr<SchemeVector> *v;
  
  visited._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  std::make_shared<SchemeVector>();
  local_68 = std::__shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>::get
                       (&list->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>);
  local_60 = &local_68;
  local_58 = 1;
  std::allocator<const_SchemePair_*>::allocator(&local_6a);
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>::
  set((set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_> *
      )local_50,__l,&local_69,&local_6a);
  std::allocator<const_SchemePair_*>::~allocator(&local_6a);
  while( true ) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)list);
    local_d1 = false;
    if (bVar1) {
      local_d1 = std::operator!=(list,&scheme_nil);
    }
    if (local_d1 == false) break;
    peVar2 = std::__shared_ptr_access<SchemeVector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SchemeVector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar3 = std::__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )list);
    std::vector<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::
    push_back(&peVar2->vec,&peVar3->car);
    std::__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)list);
    std::dynamic_pointer_cast<SchemePair,SchemeObject>(local_90);
    std::shared_ptr<SchemePair>::operator=(list,(shared_ptr<SchemePair> *)local_90);
    std::shared_ptr<SchemePair>::~shared_ptr((shared_ptr<SchemePair> *)local_90);
    local_98 = std::__shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>::get
                         (&list->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>);
    sVar4 = std::
            set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
            ::count((set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
                     *)local_50,&local_98);
    if (sVar4 != 0) {
      peVar5 = (eval_error *)__cxa_allocate_exception(0x10);
      eval_error::runtime_error(peVar5,"Vector initialization failed: not a list");
      __cxa_throw(peVar5,&eval_error::typeinfo,eval_error::~eval_error);
    }
    local_a0 = std::__shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>::get
                         (&list->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>);
    std::set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
    ::insert((set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
              *)local_50,&local_a0);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)list);
  if (bVar1) {
    visited._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
    std::set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
    ::~set((set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
            *)local_50);
    _Var6._M_pi = extraout_RDX;
    if ((visited._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
      std::shared_ptr<SchemeVector>::~shared_ptr((shared_ptr<SchemeVector> *)this);
      _Var6._M_pi = extraout_RDX_00;
    }
    sVar7.super___shared_ptr<SchemeVector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var6._M_pi;
    sVar7.super___shared_ptr<SchemeVector,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (shared_ptr<SchemeVector>)
           sVar7.super___shared_ptr<SchemeVector,_(__gnu_cxx::_Lock_policy)2>;
  }
  peVar5 = (eval_error *)__cxa_allocate_exception(0x10);
  eval_error::runtime_error(peVar5,"Vector initialization failed: not a list");
  __cxa_throw(peVar5,&eval_error::typeinfo,eval_error::~eval_error);
}

Assistant:

std::shared_ptr<SchemeVector> SchemeVector::from_list(std::shared_ptr<SchemePair> list)
{
    auto v = std::make_shared<SchemeVector>();
    std::set<const SchemePair *> visited{list.get()};
    while(list && list != scheme_nil)
    {
        v->vec.push_back(list->car);
        list = std::dynamic_pointer_cast<SchemePair>(list->cdr);
        if(visited.count(list.get()))
            throw eval_error("Vector initialization failed: not a list");
        visited.insert(list.get());
    }
    if(!list)
        throw eval_error("Vector initialization failed: not a list");
    return v;
}